

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O0

workspace * workspace_create(char *name,size_t index)

{
  list *plVar1;
  workspace *workspace;
  size_t index_local;
  char *name_local;
  
  name_local = (char *)malloc(0x28);
  if (name_local == (char *)0x0) {
    name_local = (char *)0x0;
  }
  else {
    *(char **)name_local = name;
    *(size_t *)(name_local + 8) = index;
    name_local[0x10] = '\0';
    name_local[0x11] = '\0';
    plVar1 = list_create();
    *(list **)(name_local + 0x18) = plVar1;
    name_local[0x20] = '\0';
    name_local[0x21] = '\0';
    name_local[0x22] = '\0';
    name_local[0x23] = '\0';
    name_local[0x24] = '\0';
    name_local[0x25] = '\0';
    name_local[0x26] = '\0';
    name_local[0x27] = '\0';
    if (*(long *)(name_local + 0x18) == 0) {
      free(name_local);
      name_local = (char *)0x0;
    }
  }
  return (workspace *)name_local;
}

Assistant:

struct workspace *workspace_create(const char *name, size_t index)
{
        struct workspace *workspace = malloc(sizeof(struct workspace));

        if (workspace == NULL) {
                return NULL;
        }

        workspace->name = name;
        workspace->index = index;
        workspace->is_visible = false;
        workspace->is_focused = false;
        workspace->clients = list_create();
        workspace->active_client = NULL;

        if (workspace->clients == NULL) {
                free(workspace);

                return NULL;
        }

        return workspace;
}